

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O0

void insert_to_l(lidx_t *l,int64_t _beg,int64_t _end,uint64_t offset,int min_shift)

{
  int iVar1;
  int iVar2;
  uint64_t *puVar3;
  int old_m;
  int end;
  int beg;
  int i;
  int min_shift_local;
  uint64_t offset_local;
  int64_t _end_local;
  int64_t _beg_local;
  lidx_t *l_local;
  
  end = (int)(_beg >> ((byte)min_shift & 0x3f));
  iVar2 = (int)(_end + -1 >> ((byte)min_shift & 0x3f));
  if (l->m < iVar2 + 1) {
    iVar1 = l->m;
    l->m = iVar2 + 1;
    l->m = l->m + -1;
    l->m = l->m >> 1 | l->m;
    l->m = l->m >> 2 | l->m;
    l->m = l->m >> 4 | l->m;
    l->m = l->m >> 8 | l->m;
    l->m = l->m >> 0x10 | l->m;
    l->m = l->m + 1;
    puVar3 = (uint64_t *)realloc(l->offset,(long)l->m << 3);
    l->offset = puVar3;
    memset(l->offset + iVar1,0xff,(long)((l->m - iVar1) * 8));
  }
  if (end == iVar2) {
    if (l->offset[end] == 0xffffffffffffffff) {
      l->offset[end] = offset;
    }
  }
  else {
    for (; end <= iVar2; end = end + 1) {
      if (l->offset[end] == 0xffffffffffffffff) {
        l->offset[end] = offset;
      }
    }
  }
  if (l->n < iVar2 + 1) {
    l->n = iVar2 + 1;
  }
  return;
}

Assistant:

static inline void insert_to_l(lidx_t *l, int64_t _beg, int64_t _end, uint64_t offset, int min_shift)
{
    int i, beg, end;
    beg = _beg >> min_shift;
    end = (_end - 1) >> min_shift;
    if (l->m < end + 1) {
        int old_m = l->m;
        l->m = end + 1;
        kroundup32(l->m);
        l->offset = (uint64_t*)realloc(l->offset, l->m * sizeof(uint64_t));
        memset(l->offset + old_m, 0xff, 8 * (l->m - old_m)); // fill l->offset with (uint64_t)-1
    }
    if (beg == end) { // to save a loop in this case
        if (l->offset[beg] == (uint64_t)-1) l->offset[beg] = offset;
    } else {
        for (i = beg; i <= end; ++i)
            if (l->offset[i] == (uint64_t)-1) l->offset[i] = offset;
    }
    if (l->n < end + 1) l->n = end + 1;
}